

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_set_socket_functions.c
# Opt level: O3

int default_asetsockopt(ares_socket_t sock,ares_socket_opt_t opt,void *val,ares_socklen_t val_size,
                       void *user_data)

{
  ares_bool_t aVar1;
  int iVar2;
  size_t len;
  int *piVar3;
  ares_bool_t *pval;
  int oval;
  undefined4 local_1c;
  
  switch(opt) {
  case ARES_SOCKET_OPT_SENDBUF_SIZE:
    if (val_size != 4) goto LAB_001162e6;
    iVar2 = 7;
    break;
  case ARES_SOCKET_OPT_RECVBUF_SIZE:
    if (val_size != 4) goto LAB_001162e6;
    iVar2 = 8;
    break;
  case ARES_SOCKET_OPT_BIND_DEVICE:
    len = ares_strnlen((char *)val,(ulong)val_size);
    aVar1 = ares_str_isprint((char *)val,len);
    if (aVar1 == ARES_FALSE) goto LAB_001162e6;
    iVar2 = 0x19;
    goto LAB_001162d9;
  case ARES_SOCKET_OPT_TCP_FASTOPEN:
    if (val_size == 4) {
      local_1c = *val;
      iVar2 = setsockopt(sock,6,0x1e,&local_1c,4);
      return iVar2;
    }
LAB_001162e6:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return -1;
  default:
    piVar3 = __errno_location();
    *piVar3 = 0x26;
    return -1;
  }
  val_size = 4;
LAB_001162d9:
  iVar2 = setsockopt(sock,1,iVar2,val,val_size);
  return iVar2;
}

Assistant:

static int default_asetsockopt(ares_socket_t sock, ares_socket_opt_t opt,
                               const void *val, ares_socklen_t val_size,
                               void *user_data)
{
  switch (opt) {
    case ARES_SOCKET_OPT_SENDBUF_SIZE:
      if (val_size != sizeof(int)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
      return setsockopt(sock, SOL_SOCKET, SO_SNDBUF, val, val_size);

    case ARES_SOCKET_OPT_RECVBUF_SIZE:
      if (val_size != sizeof(int)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
      return setsockopt(sock, SOL_SOCKET, SO_RCVBUF, val, val_size);

    case ARES_SOCKET_OPT_BIND_DEVICE:
      /* Count the number of characters before NULL terminator then
       * validate those are all printable */
      if (!ares_str_isprint(val, ares_strnlen(val, (size_t)val_size))) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
#ifdef SO_BINDTODEVICE
      return setsockopt(sock, SOL_SOCKET, SO_BINDTODEVICE, val, val_size);
#else
      SET_SOCKERRNO(ENOSYS);
      return -1;
#endif

    case ARES_SOCKET_OPT_TCP_FASTOPEN:
      if (val_size != sizeof(ares_bool_t)) {
        SET_SOCKERRNO(EINVAL);
        return -1;
      }
#if defined(TFO_CLIENT_SOCKOPT)
      {
        int                oval;
        const ares_bool_t *pval = val;
        oval                    = (int)*pval;
        return setsockopt(sock, IPPROTO_TCP, TFO_CLIENT_SOCKOPT, (void *)&oval,
                          sizeof(oval));
      }
#elif TFO_SUPPORTED
      return 0;
#else
      SET_SOCKERRNO(ENOSYS);
      return -1;
#endif
  }

  (void)user_data;
  SET_SOCKERRNO(ENOSYS);
  return -1;
}